

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O2

bool myutils::parse_addr(char *addr,string *ip,int *port)

{
  int iVar1;
  char *pcVar2;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar1 = bcmp(addr,"tcp://",6);
  if (iVar1 == 0) {
    pcVar2 = strrchr(addr + 6,0x3a);
    if (pcVar2 != (char *)0x0) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,addr + 6,pcVar2);
      std::__cxx11::string::operator=((string *)ip,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
      iVar1 = atoi(pcVar2 + 1);
      *port = iVar1;
      return true;
    }
  }
  return false;
}

Assistant:

bool parse_addr(const char* addr, string* ip, int* port)
    {
        if (memcmp(addr, "tcp://", 6) != 0) return false;
        const char* p = addr + 6;
        const char* p2 = strrchr(p, ':');
        if (p2) {
            *ip = string(p, p2 - p);
            *port = atoi(p2 + 1);
            return true;
        }
        else {
            return false;
        }
    }